

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int write_path_table(archive_write *a,int type_m,vdd *vdd)

{
  void *pvVar1;
  isoent **ppiVar2;
  isoent *piVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  long lVar14;
  ulong __n;
  long lVar15;
  
  lVar13 = 0;
  uVar11 = 0;
  uVar8 = 0;
  do {
    if (vdd->max_depth <= lVar13) {
      if ((uVar8 & 0xfff) == 0) {
        return (int)uVar11;
      }
      iVar4 = write_null(a,0x1000 - (uVar8 & 0xfff));
      return iVar4;
    }
    iVar4 = vdd->pathtbl[lVar13].cnt;
    if (iVar4 == 0) {
      uVar11 = 0;
    }
    else {
      pvVar1 = a->format_data;
      lVar9 = *(long *)((long)pvVar1 + 0x102e0);
      uVar7 = (long)pvVar1 + (0x102dc - lVar9);
      lVar14 = (long)pvVar1 + (0x102db - lVar9);
      ppiVar2 = vdd->pathtbl[lVar13].sorted;
      uVar11 = 0;
      for (lVar15 = 0; iVar10 = (int)uVar11, lVar15 < iVar4; lVar15 = lVar15 + 1) {
        piVar3 = ppiVar2[lVar15];
        __n = 1;
        if (piVar3->identifier != (char *)0x0) {
          __n = (ulong)piVar3->id_len;
        }
        sVar12 = (lVar14 - uVar7) + 1;
        uVar11 = __n + 9;
        if (lVar9 - sVar12 < uVar11) {
          iVar4 = wb_consume(a,sVar12);
          if (iVar4 < 0) {
            return iVar4;
          }
          pvVar1 = a->format_data;
          lVar9 = *(long *)((long)pvVar1 + 0x102e0);
          uVar7 = (long)pvVar1 + (0x102dc - lVar9);
          lVar14 = (long)pvVar1 + (0x102db - lVar9);
        }
        *(char *)(lVar14 + 1) = (char)__n;
        *(undefined1 *)(lVar14 + 2) = 0;
        uVar5 = piVar3->dir_location;
        if (type_m == 0) {
          *(uint *)(lVar14 + 3) = uVar5;
          uVar6 = piVar3->parent->dir_number;
          uVar5 = uVar6 >> 8;
        }
        else {
          *(uint *)(lVar14 + 3) =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          uVar5 = piVar3->parent->dir_number;
          uVar6 = uVar5 >> 8;
        }
        *(char *)(lVar14 + 7) = (char)uVar6;
        *(char *)(lVar14 + 8) = (char)uVar5;
        if (piVar3->identifier == (char *)0x0) {
          *(undefined1 *)(lVar14 + 9) = 0;
        }
        else {
          memcpy((undefined1 *)(lVar14 + 9),piVar3->identifier,__n);
        }
        if ((__n & 1) != 0) {
          __n = __n + 1;
          *(undefined1 *)(lVar14 + uVar11) = 0;
        }
        uVar11 = (ulong)(iVar10 + (int)__n + 8);
        lVar14 = lVar14 + __n + 8;
        iVar4 = vdd->pathtbl[lVar13].cnt;
      }
      sVar12 = (lVar14 + 1U) - uVar7;
      if ((uVar7 <= lVar14 + 1U && sVar12 != 0) && (iVar4 = wb_consume(a,sVar12), iVar4 < 0)) {
        return iVar4;
      }
      if (iVar10 < 0) {
        return iVar10;
      }
    }
    uVar8 = uVar8 + uVar11;
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

static int
write_path_table(struct archive_write *a, int type_m, struct vdd *vdd)
{
	int depth, r;
	size_t path_table_size;

	r = ARCHIVE_OK;
	path_table_size = 0;
	for (depth = 0; depth < vdd->max_depth; depth++) {
		r = _write_path_table(a, type_m, depth, vdd);
		if (r < 0)
			return (r);
		path_table_size += r;
	}

	/* Write padding data. */
	path_table_size = path_table_size % PATH_TABLE_BLOCK_SIZE;
	if (path_table_size > 0)
		r = write_null(a, PATH_TABLE_BLOCK_SIZE - path_table_size);
	return (r);
}